

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O3

int stbi__gif_test(stbi__context *s)

{
  int iVar1;
  stbi_uc *psVar2;
  stbi_uc *psVar3;
  stbi_uc *psVar4;
  stbi_uc sVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  psVar4 = s->img_buffer;
  psVar2 = s->img_buffer_end;
  if (psVar4 < psVar2) {
    psVar3 = psVar4 + 1;
    s->img_buffer = psVar3;
    sVar5 = *psVar4;
  }
  else {
    if (s->read_from_callbacks == 0) {
      uVar6 = 0;
      goto LAB_0014694d;
    }
    psVar4 = s->buffer_start;
    iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
    if (iVar1 == 0) {
      s->read_from_callbacks = 0;
      psVar2 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar5 = '\0';
    }
    else {
      psVar2 = psVar4 + iVar1;
      sVar5 = *psVar4;
    }
    s->img_buffer_end = psVar2;
    psVar3 = s->buffer_start + 1;
    s->img_buffer = psVar3;
  }
  uVar7 = 0;
  uVar8 = 0;
  uVar6 = uVar7;
  if (sVar5 == 'G') {
    if (psVar3 < psVar2) {
      psVar4 = psVar3 + 1;
      s->img_buffer = psVar4;
      sVar5 = *psVar3;
    }
    else {
      uVar6 = uVar8;
      if (s->read_from_callbacks == 0) goto LAB_0014694d;
      psVar4 = s->buffer_start;
      iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
      if (iVar1 == 0) {
        s->read_from_callbacks = 0;
        psVar2 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        sVar5 = '\0';
      }
      else {
        psVar2 = psVar4 + iVar1;
        sVar5 = *psVar4;
      }
      s->img_buffer_end = psVar2;
      psVar4 = s->buffer_start + 1;
      s->img_buffer = psVar4;
    }
    uVar6 = uVar7;
    if (sVar5 == 'I') {
      if (psVar4 < psVar2) {
        psVar3 = psVar4 + 1;
        s->img_buffer = psVar3;
        sVar5 = *psVar4;
      }
      else {
        uVar6 = uVar8;
        if (s->read_from_callbacks == 0) goto LAB_0014694d;
        psVar4 = s->buffer_start;
        iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
        if (iVar1 == 0) {
          s->read_from_callbacks = 0;
          psVar2 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar5 = '\0';
        }
        else {
          psVar2 = psVar4 + iVar1;
          sVar5 = *psVar4;
        }
        s->img_buffer_end = psVar2;
        psVar3 = s->buffer_start + 1;
        s->img_buffer = psVar3;
      }
      uVar6 = uVar7;
      if (sVar5 == 'F') {
        if (psVar3 < psVar2) {
          psVar4 = psVar3 + 1;
          s->img_buffer = psVar4;
          sVar5 = *psVar3;
        }
        else {
          uVar6 = uVar8;
          if (s->read_from_callbacks == 0) goto LAB_0014694d;
          psVar4 = s->buffer_start;
          iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
          if (iVar1 == 0) {
            s->read_from_callbacks = 0;
            psVar2 = s->buffer_start + 1;
            s->buffer_start[0] = '\0';
            sVar5 = '\0';
          }
          else {
            psVar2 = psVar4 + iVar1;
            sVar5 = *psVar4;
          }
          s->img_buffer_end = psVar2;
          psVar4 = s->buffer_start + 1;
          s->img_buffer = psVar4;
        }
        uVar6 = uVar8;
        if (sVar5 == '8') {
          if (psVar4 < psVar2) {
            psVar3 = psVar4 + 1;
            s->img_buffer = psVar3;
            sVar5 = *psVar4;
          }
          else {
            if (s->read_from_callbacks == 0) goto LAB_0014694d;
            psVar4 = s->buffer_start;
            iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
            if (iVar1 == 0) {
              s->read_from_callbacks = 0;
              psVar2 = s->buffer_start + 1;
              s->buffer_start[0] = '\0';
              sVar5 = '\0';
            }
            else {
              psVar2 = psVar4 + iVar1;
              sVar5 = *psVar4;
            }
            s->img_buffer_end = psVar2;
            psVar3 = s->buffer_start + 1;
            s->img_buffer = psVar3;
          }
          if ((sVar5 == '9') || (sVar5 == '7')) {
            if (psVar3 < psVar2) {
              s->img_buffer = psVar3 + 1;
              sVar5 = *psVar3;
            }
            else {
              if (s->read_from_callbacks == 0) goto LAB_0014694d;
              psVar2 = s->buffer_start;
              iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar2,s->buflen);
              if (iVar1 == 0) {
                s->read_from_callbacks = 0;
                psVar4 = s->buffer_start + 1;
                s->buffer_start[0] = '\0';
                sVar5 = '\0';
              }
              else {
                psVar4 = psVar2 + iVar1;
                sVar5 = *psVar2;
              }
              s->img_buffer_end = psVar4;
              s->img_buffer = s->buffer_start + 1;
            }
            uVar6 = (uint)(sVar5 == 'a');
          }
        }
      }
    }
  }
LAB_0014694d:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return uVar6;
}

Assistant:

static int stbi__gif_test(stbi__context *s)
{
   int r = stbi__gif_test_raw(s);
   stbi__rewind(s);
   return r;
}